

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtracer-inl.h
# Opt level: O1

void __thiscall
spdlog::details::backtracer::foreach_pop
          (backtracer *this,function<void_(const_spdlog::details::log_msg_&)> *fun)

{
  int iVar1;
  ulong uVar2;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  uVar2 = (this->messages_).head_;
  if ((this->messages_).tail_ != uVar2) {
    do {
      if ((fun->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*fun->_M_invoker)((_Any_data *)fun,
                         &(this->messages_).v_.
                          super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar2].super_log_msg);
      uVar2 = ((this->messages_).head_ + 1) % (this->messages_).max_items_;
      (this->messages_).head_ = uVar2;
    } while ((this->messages_).tail_ != uVar2);
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

SPDLOG_INLINE void backtracer::foreach_pop(std::function<void(const details::log_msg &)> fun)
{
    std::lock_guard<std::mutex> lock{mutex_};
    while (!messages_.empty())
    {
        auto &front_msg = messages_.front();
        fun(front_msg);
        messages_.pop_front();
    }
}